

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<unsigned_int> * __thiscall
google::protobuf::util::converter::DataPiece::GenericConvert<unsigned_int>
          (StatusOr<unsigned_int> *__return_storage_ptr__,DataPiece *this)

{
  StringPiece default_string;
  uint uVar1;
  char *pcVar2;
  uint *puVar3;
  ulong uVar4;
  uint in_EDX;
  bool bVar5;
  StringPiece value_str;
  StringPiece value_str_00;
  StringPiece value_str_01;
  StringPiece value_str_02;
  StringPiece local_80;
  string local_70;
  undefined1 local_50 [44];
  uint local_24;
  
  puVar3 = &switchD_00325b11::switchdataD_0036c550;
  switch(this->type_) {
  case TYPE_INT32:
    local_24 = (this->field_2).i32_;
    bVar5 = local_24 != 0;
    uVar1 = ((0 < (int)local_24) - 1) + (uint)(0 < (int)local_24);
    if (!bVar5) {
      uVar1 = 0;
    }
    uVar4 = (ulong)bVar5;
    if (uVar1 != bVar5) {
      ValueAsString<int>(&local_70,local_24);
      pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
      value_str.length_ = uVar4;
      value_str.ptr_ = pcVar2;
      anon_unknown_1::InvalidArgument
                ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
      StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,(Status *)local_50);
      goto LAB_00325cb9;
    }
    break;
  case TYPE_INT64:
    uVar4 = (this->field_2).i64_;
    local_24 = (uint)uVar4;
    if ((uVar4 >> 0x20 != 0) ||
       (puVar3 = (uint *)CONCAT71(0x36c5,local_24 == 0), (uVar4 != 0) == (local_24 == 0))) {
      ValueAsString<long>(&local_70,uVar4);
      pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
      value_str_02.length_ = (stringpiece_ssize_type)puVar3;
      value_str_02.ptr_ = pcVar2;
      anon_unknown_1::InvalidArgument
                ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str_02);
      StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,(Status *)local_50);
      goto LAB_00325cb9;
    }
    break;
  case TYPE_UINT32:
    local_50._0_4_ = (this->field_2).i32_;
    puVar3 = (uint *)local_50;
    goto LAB_00325c0f;
  case TYPE_UINT64:
    uVar4 = (this->field_2).u64_;
    local_24 = (uint)uVar4;
    if ((uVar4 >> 0x20 != 0) ||
       (puVar3 = (uint *)CONCAT71(0x36c5,local_24 == 0), (uVar4 != 0) == (local_24 == 0))) {
      ValueAsString<unsigned_long>(&local_70,uVar4);
      pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
      value_str_00.length_ = (stringpiece_ssize_type)puVar3;
      value_str_00.ptr_ = pcVar2;
      anon_unknown_1::InvalidArgument
                ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str_00);
      StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,(Status *)local_50);
      goto LAB_00325cb9;
    }
    break;
  case TYPE_DOUBLE:
    (anonymous_namespace)::ValidateNumberConversion<unsigned_int,double>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).double_,in_EDX,
               (this->field_2).double_);
    return __return_storage_ptr__;
  case TYPE_FLOAT:
    (anonymous_namespace)::ValidateNumberConversion<unsigned_int,float>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).float_,in_EDX,
               (this->field_2).float_);
    return __return_storage_ptr__;
  default:
    StringPiece::StringPiece
              (&local_80,"Wrong type. Bool, Enum, String and Cord not supported in GenericConvert.")
    ;
    default_string.length_ = local_80.length_;
    default_string.ptr_ = local_80.ptr_;
    ValueAsStringOrDefault_abi_cxx11_(&local_70,this,default_string);
    pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
    value_str_01.length_ = local_80.length_;
    value_str_01.ptr_ = pcVar2;
    anon_unknown_1::InvalidArgument
              ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str_01);
    StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,(Status *)local_50);
LAB_00325cb9:
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  }
  puVar3 = &local_24;
LAB_00325c0f:
  StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,puVar3);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> DataPiece::GenericConvert() const {
  switch (type_) {
    case TYPE_INT32:
      return NumberConvertAndCheck<To, int32>(i32_);
    case TYPE_INT64:
      return NumberConvertAndCheck<To, int64>(i64_);
    case TYPE_UINT32:
      return NumberConvertAndCheck<To, uint32>(u32_);
    case TYPE_UINT64:
      return NumberConvertAndCheck<To, uint64>(u64_);
    case TYPE_DOUBLE:
      return NumberConvertAndCheck<To, double>(double_);
    case TYPE_FLOAT:
      return NumberConvertAndCheck<To, float>(float_);
    default:  // TYPE_ENUM, TYPE_STRING, TYPE_CORD, TYPE_BOOL
      return InvalidArgument(ValueAsStringOrDefault(
          "Wrong type. Bool, Enum, String and Cord not supported in "
          "GenericConvert."));
  }
}